

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

void wake_pending_write(CManager_conflict cm,CMConnection conn,void *param)

{
  CMConnHandlerList p_Var1;
  CMConnHandlerList p_Var2;
  CMConnHandlerList p_Var3;
  
  p_Var2 = conn->write_callbacks;
  p_Var3 = p_Var2;
  if (p_Var2->func != wake_pending_write) {
    do {
      p_Var3 = p_Var2;
      if (p_Var2->client_data == param) break;
      p_Var3 = p_Var2 + 1;
      p_Var1 = p_Var2 + 1;
      p_Var2 = p_Var3;
    } while (p_Var1->func != wake_pending_write);
  }
  p_Var3->func = (CMCloseHandlerFunc)0x0;
  INT_CMCondition_signal(cm,(int)param);
  return;
}

Assistant:

static void
 wake_pending_write(CManager cm, CMConnection conn, void *param)
 {
     int cond = (int)(intptr_t)param;
     remove_pending_write_callback(conn, wake_pending_write, param);
     INT_CMCondition_signal(cm, cond);
 }